

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_rotation_z(mat4 *__return_storage_ptr__,float theta)

{
  float fVar1;
  float fVar2;
  
  fVar1 = cosf(theta);
  fVar2 = sinf(theta);
  __return_storage_ptr__->m[0] = fVar1;
  __return_storage_ptr__->m[1] = -fVar2;
  __return_storage_ptr__->m[2] = 0.0;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->m[4] = fVar2;
  __return_storage_ptr__->m[5] = fVar1;
  __return_storage_ptr__->m[6] = 0.0;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[8] = 0.0;
  __return_storage_ptr__->m[9] = 0.0;
  __return_storage_ptr__->m[10] = 1.0;
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_rotation_z(float theta) {
    float c = cosf(theta);
    float s = sinf(theta);
    return mat4_create(
            c, -s, 0.0f, 0.0f,
            s, c, 0.0f, 0.0f,
            0.0f, 0.0f, 1.0f, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}